

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateFieldInfo
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  bool bVar1;
  int iVar2;
  string_view local_30;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  Printer *printer_local;
  ImmutablePrimitiveFieldLiteGenerator *this_local;
  
  local_20 = output;
  output_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)printer;
  printer_local = (Printer *)this;
  iVar2 = FieldDescriptor::number(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar2,local_20);
  iVar2 = GetExperimentalJavaFieldType(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar2,local_20);
  bVar1 = HasHasbit(this->descriptor_);
  if (bVar1) {
    WriteIntToUtf16CharSequence(this->messageBitIndex_,local_20);
  }
  this_00 = output_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"\"$name$_\",\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)this_00,&this->variables_,local_30);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  if (HasHasbit(descriptor_)) {
    WriteIntToUtf16CharSequence(messageBitIndex_, output);
  }
  printer->Print(variables_, "\"$name$_\",\n");
}